

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

ssize_t __thiscall smf::MidiFile::read(MidiFile *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  ulong __new_size;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  undefined6 extraout_var;
  MidiEventList *pMVar7;
  void *__buf_00;
  ulong uVar8;
  undefined4 in_register_00000034;
  istream *input;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 uVar12;
  uchar runningCommand;
  string filename;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  MidiEvent event;
  char local_1fa [2];
  Binasc local_1f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  undefined1 local_1b8 [24];
  int local_1a0;
  int local_19c;
  ios_base local_138 [264];
  
  input = (istream *)CONCAT44(in_register_00000034,__fd);
  this->m_rwstatus = true;
  iVar4 = std::istream::peek();
  if (iVar4 != 0x4d) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    Binasc::Binasc(&local_1f8);
    Binasc::writeToBinary(&local_1f8,(ostream *)(local_1b8 + 0x10),input);
    std::istream::seekg((long)local_1b8,_S_beg);
    iVar4 = std::istream::peek();
    if (iVar4 == 0x4d) {
      uVar8 = read(this,(int)local_1b8,__buf_00,__nbytes);
      uVar12 = (undefined1)uVar8;
      uVar8 = uVar8 & 0xffffffff;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Bad MIDI data input",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
      std::ostream::put('\b');
      uVar12 = false;
      std::ostream::flush();
      uVar8 = 0;
    }
    this->m_rwstatus = (bool)uVar12;
    Binasc::~Binasc(&local_1f8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    goto LAB_001192e5;
  }
  std::__cxx11::string::string
            ((string *)&local_1f8,(this->m_readFileName)._M_dataplus._M_p,(allocator *)local_1b8);
  iVar4 = std::istream::get();
  if (iVar4 == 0x4d) {
    iVar4 = std::istream::get();
    if (iVar4 != 0x54) {
      if (iVar4 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": unexpected end of file.",0x19);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Expecting \'T\' at second byte, but found nothing.",0x30);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a MIDI file",0x13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Expecting \'T\' at second byte but got \'",0x26);
        local_1b8[0] = SUB41(iVar4,0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_1b8,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      goto LAB_001192cc;
    }
    iVar4 = std::istream::get();
    if (iVar4 != 0x68) {
      if (iVar4 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": unexpected end of file.",0x19);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Expecting \'h\' at third byte, but found nothing.",0x2f);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a MIDI file",0x13);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Expecting \'h\' at third byte but got \'",0x25);
        local_1b8[0] = SUB41(iVar4,0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_1b8,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      goto LAB_001192cc;
    }
    iVar4 = std::istream::get();
    if (iVar4 != 100) {
      if (iVar4 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": unexpected end of file.",0x19);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Expecting \'d\' at fourth byte, but found nothing.",0x30);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a MIDI file",0x13);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Expecting \'d\' at fourth byte but got \'",0x26);
        local_1b8[0] = SUB41(iVar4,0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_1b8,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      goto LAB_001192cc;
    }
    uVar6 = readLittleEndian4Bytes(input);
    if (uVar6 != 6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," is not a MIDI 1.0 Standard MIDI file.",0x26);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"The header size is ",0x13);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes.",7);
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_001192cc;
    }
    uVar3 = readLittleEndian2Bytes(input);
    if (uVar3 == 0) {
      bVar2 = true;
    }
    else {
      if (uVar3 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: cannot handle a type-",0x1c);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," MIDI file",10);
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_001192cc;
      }
      bVar2 = false;
    }
    uVar3 = readLittleEndian2Bytes(input);
    uVar8 = CONCAT62(extraout_var,uVar3) & 0xffffffff;
    if (bVar2 && uVar3 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: Type 0 MIDI file can only contain one track",0x32);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Instead track count is: ",0x18);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_001192cc;
    }
    clear(this);
    pMVar7 = *(this->m_events).
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (pMVar7 != (MidiEventList *)0x0) {
      MidiEventList::~MidiEventList(pMVar7);
      operator_delete(pMVar7);
    }
    __new_size = (ulong)uVar3;
    std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
              (&this->m_events,__new_size);
    if ((short)uVar8 != 0) {
      uVar10 = 0;
      do {
        pMVar7 = (MidiEventList *)operator_new(0x18);
        MidiEventList::MidiEventList(pMVar7);
        (this->m_events).
        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] = pMVar7;
        MidiEventList::reserve
                  ((this->m_events).
                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10],10000);
        MidiEventList::clear
                  ((this->m_events).
                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10]);
        uVar10 = uVar10 + 1;
      } while (__new_size != uVar10);
    }
    uVar3 = readLittleEndian2Bytes(input);
    uVar9 = (uint)uVar3;
    if ((short)uVar3 < 0) {
      uVar1 = (uVar3 >> 8) + 0x1e;
      if (((byte)uVar1 < 7) && ((99U >> (uVar1 & 0x1f) & 1) != 0)) {
        iVar4 = *(int *)(&DAT_0012926c + (ulong)(uVar1 & 0xff) * 4);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Warning: unknown FPS: ",0x16);
        iVar4 = 0x100 - (uint)(uVar3 >> 8);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Using non-standard FPS: ",0x18);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar4);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      uVar9 = (uVar9 & 0xff) * iVar4;
    }
    this->m_ticksPerQuarterNote = uVar9;
    MidiEvent::MidiEvent((MidiEvent *)local_1b8);
    local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((short)uVar8 != 0) {
      uVar8 = 0;
      do {
        local_1fa[1] = 0;
        iVar4 = std::istream::get();
        if (iVar4 != 0x4d) {
          if (iVar4 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,": unexpected end of file.",0x19);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Expecting \'M\' at first byte in track, but found nothing.",0x38);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a MIDI file",0x13);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Expecting \'M\' at first byte in track but got \'",
                       0x2e);
            local_1fa[0] = (char)iVar4;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_1fa,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
LAB_00119a21:
          this->m_rwstatus = false;
          uVar8 = 0;
          goto LAB_00119a27;
        }
        iVar4 = std::istream::get();
        if (iVar4 != 0x54) {
          if (iVar4 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,": unexpected end of file.",0x19);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Expecting \'T\' at second byte in track, but found nothing.",0x39);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a MIDI file",0x13);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Expecting \'T\' at second byte in track but got \'",
                       0x2f);
            local_1fa[0] = (char)iVar4;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_1fa,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          goto LAB_00119a21;
        }
        iVar4 = std::istream::get();
        if (iVar4 != 0x72) {
          if (iVar4 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,": unexpected end of file.",0x19);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Expecting \'r\' at third byte in track, but found nothing.",0x38);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a MIDI file",0x13);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Expecting \'r\' at third byte in track but got \'",
                       0x2e);
            local_1fa[0] = (char)iVar4;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_1fa,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          goto LAB_00119a21;
        }
        iVar4 = std::istream::get();
        if (iVar4 != 0x6b) {
          if (iVar4 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,": unexpected end of file.",0x19);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Expecting \'k\' at fourth byte in track, but found nothing.",0x39);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a MIDI file",0x13);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Expecting \'k\' at fourth byte in track but got \'",
                       0x2f);
            local_1fa[0] = (char)iVar4;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_1fa,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          goto LAB_00119a21;
        }
        uVar6 = readLittleEndian4Bytes(input);
        MidiEventList::reserve
                  ((this->m_events).
                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8],
                   (int)(((uint)(uVar6 >> 0x1f) & 1) + (int)uVar6) >> 1);
        MidiEventList::clear
                  ((this->m_events).
                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8]);
        if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
          lVar11 = 0;
          do {
            uVar6 = readVLValue(this,input);
            iVar4 = extractMidiData(this,input,&local_1d8,(uchar *)(local_1fa + 1));
            if (iVar4 == 0) goto LAB_00119a21;
            MidiMessage::setMessage((MidiMessage *)local_1b8,&local_1d8);
            lVar11 = uVar6 + (long)(int)lVar11;
            local_1a0 = (int)lVar11;
            local_19c = (int)uVar8;
            if ((*local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0xff) &&
               (local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[1] == '/')) {
              MidiEventList::push_back
                        ((this->m_events).
                         super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar8],(MidiEvent *)local_1b8);
              break;
            }
            MidiEventList::push_back
                      ((this->m_events).
                       super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8],(MidiEvent *)local_1b8);
          } while (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != __new_size);
    }
    this->m_theTimeState = 1;
    markSequence(this);
    uVar8 = CONCAT71((int7)(uVar8 >> 8),this->m_rwstatus);
LAB_00119a27:
    if (local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    MidiEvent::~MidiEvent((MidiEvent *)local_1b8);
  }
  else {
    if (iVar4 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"In file ",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": unexpected end of file.",0x19);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Expecting \'M\' at first byte, but found nothing.",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_1f8._0_8_,local_1f8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a MIDI file",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Expecting \'M\' at first byte but got \'",0x25);
      local_1b8[0] = SUB41(iVar4,0);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1b8,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
LAB_001192cc:
    this->m_rwstatus = false;
    uVar8 = 0;
  }
  if ((char *)local_1f8._0_8_ != (char *)((long)&local_1f8 + 0x10U)) {
    operator_delete((void *)local_1f8._0_8_);
  }
LAB_001192e5:
  return uVar8 & 0xffffffff;
}

Assistant:

bool MidiFile::read(std::istream& input) {
	m_rwstatus = true;
	if (input.peek() != 'M') {
		// If the first byte in the input stream is not 'M', then presume that
		// the MIDI file is in the binasc format which is an ASCII representation
		// of the MIDI file.  Convert the binasc content into binary content and
		// then continue reading with this function.
		std::stringstream binarydata;
		Binasc binasc;
		binasc.writeToBinary(binarydata, input);
		binarydata.seekg(0, std::ios_base::beg);
		if (binarydata.peek() != 'M') {
			std::cerr << "Bad MIDI data input" << std::endl;
			m_rwstatus = false;
			return m_rwstatus;
		} else {
			m_rwstatus = read(binarydata);
			return m_rwstatus;
		}
	}

	std::string filename = getFilename();

	int    character;
	// uchar  buffer[123456] = {0};
	ulong  longdata;
	ushort shortdata;


	// Read the MIDI header (4 bytes of ID, 4 byte data size,
	// anticipated 6 bytes of data.

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'M' at first byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'M') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'M' at first byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'T' at second byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'T') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'T' at second byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'h' at third byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'h') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'h' at third byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'd' at fourth byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'd') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'd' at fourth byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// read header size (allow larger header size?)
	longdata = readLittleEndian4Bytes(input);
	if (longdata != 6) {
		std::cerr << "File " << filename
		     << " is not a MIDI 1.0 Standard MIDI file." << std::endl;
		std::cerr << "The header size is " << longdata << " bytes." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #1: format type
	int type;
	shortdata = readLittleEndian2Bytes(input);
	switch (shortdata) {
		case 0:
			type = 0;
			break;
		case 1:
			type = 1;
			break;
		case 2:
			// Type-2 MIDI files should probably be allowed as well,
			// but I have never seen one in the wild to test with.
		default:
			std::cerr << "Error: cannot handle a type-" << shortdata
			     << " MIDI file" << std::endl;
			m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #2: track count
	int tracks;
	shortdata = readLittleEndian2Bytes(input);
	if (type == 0 && shortdata != 1) {
		std::cerr << "Error: Type 0 MIDI file can only contain one track" << std::endl;
		std::cerr << "Instead track count is: " << shortdata << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else {
		tracks = shortdata;
	}
	clear();
	if (m_events[0] != NULL) {
		delete m_events[0];
	}
	m_events.resize(tracks);
	for (int z=0; z<tracks; z++) {
		m_events[z] = new MidiEventList;
		m_events[z]->reserve(10000);   // Initialize with 10,000 event storage.
		m_events[z]->clear();
	}

	// Header parameter #3: Ticks per quarter note
	shortdata = readLittleEndian2Bytes(input);
	if (shortdata >= 0x8000) {
		int framespersecond = 255 - ((shortdata >> 8) & 0x00ff) + 1;
		int subframes       = shortdata & 0x00ff;
		switch (framespersecond) {
			case 25:  framespersecond = 25; break;
			case 24:  framespersecond = 24; break;
			case 29:  framespersecond = 29; break;  // really 29.97 for color television
			case 30:  framespersecond = 30; break;
			default:
					std::cerr << "Warning: unknown FPS: " << framespersecond << std::endl;
					std::cerr << "Using non-standard FPS: " << framespersecond << std::endl;
		}
		m_ticksPerQuarterNote = framespersecond * subframes;

		// std::cerr << "SMPTE ticks: " << m_ticksPerQuarterNote << " ticks/sec" << std::endl;
		// std::cerr << "SMPTE frames per second: " << framespersecond << std::endl;
		// std::cerr << "SMPTE subframes per frame: " << subframes << std::endl;
	}  else {
		m_ticksPerQuarterNote = shortdata;
	}


	//////////////////////////////////////////////////
	//
	// now read individual tracks:
	//

	uchar runningCommand;
	MidiEvent event;
	std::vector<uchar> bytes;
	int xstatus;
	// int barline;

	for (int i=0; i<tracks; i++) {
		runningCommand = 0;

		// std::cout << "\nReading Track: " << i + 1 << flush;

		// read track header...

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'M' at first byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'M') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'M' at first byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'T' at second byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'T') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'T' at second byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'r' at third byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'r') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'r' at third byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'k') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		// Now read track chunk size and throw it away because it is
		// not really necessary since the track MUST end with an
		// end of track meta event, and many MIDI files found in the wild
		// do not correctly give the track size.
		longdata = readLittleEndian4Bytes(input);

		// set the size of the track allocation so that it might
		// approximately fit the data.
		m_events[i]->reserve((int)longdata/2);
		m_events[i]->clear();

		// process the track
		int absticks = 0;
		// barline = 1;
		while (!input.eof()) {
			longdata = readVLValue(input);
			//std::cout << "ticks = " << longdata << std::endl;
			absticks += longdata;
			xstatus = extractMidiData(input, bytes, runningCommand);
			if (xstatus == 0) {
				m_rwstatus = false;  return m_rwstatus;
			}
			event.setMessage(bytes);
			//std::cout << "command = " << std::hex << (int)event.data[0] << std::dec << std::endl;
			if (bytes[0] == 0xff && (bytes[1] == 1 ||
					bytes[1] == 2 || bytes[1] == 3 || bytes[1] == 4)) {
				// mididata.push_back('\0');
				// std::cout << '\t';
				// for (int m=0; m<event.data[2]; m++) {
				//    std::cout << event.data[m+3];
				// }
				// std::cout.flush();
			} else if (bytes[0] == 0xff && bytes[1] == 0x2f) {
				// end of track message
				// uncomment out the following three lines if you don't want
				// to see the end of track message (which is always required,
				// and added automatically when a MIDI is written.
				event.tick = absticks;
				event.track = i;
				m_events[i]->push_back(event);
				break;
			}

			if (bytes[0] != 0xff && bytes[0] != 0xf0) {
				event.tick = absticks;
				event.track = i;
				m_events[i]->push_back(event);
			} else {
				event.tick = absticks;
				event.track = i;
				m_events[i]->push_back(event);
			}

		}

	}

	m_theTimeState = TIME_STATE_ABSOLUTE;
	markSequence();
	return m_rwstatus;
}